

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_code.cpp
# Opt level: O1

void Init(void)

{
  int iVar1;
  undefined8 uVar2;
  DebugStream local_59;
  char *local_58;
  long local_50;
  char local_48 [16];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"r_code","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_38,local_38 + local_30);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_58,local_50);
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"r_code library loaded",0x15);
    DebugStream::~DebugStream(&local_59);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void Init()
{
    debug("r_code") << "r_code library loaded";
}